

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icuinfo.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  FILE *__s;
  char *errorCode;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  errorCode = (char *)argv;
  uVar1 = u_parseArgs(argc,argv,8,options);
  if ((int)uVar1 < 0) {
    errorCode = "error in command line argument \"%s\"\n";
    fprintf(_stderr,"error in command line argument \"%s\"\n",argv[-uVar1]);
  }
  if (options[1].doesOccur != '\0' || options[0].doesOccur != '\0') {
    fprintf(_stderr,"%s: Output information about the current ICU\n",*argv);
    fwrite("Options:\n -h     or  --help                 - Print this help message.\n -m     or  --millisecond-time     - Print the current UTC time in milliseconds.\n -d <dir>   or  --icudatadir <dir> - Set the ICU Data Directory\n -v                                - Print version and configuration information about ICU\n -K         or  --cleanup          - Call u_cleanup() before exitting (will attempt to unload plugins)\n\nIf no arguments are given, the tool will print ICU version and configuration information.\n"
           ,0x1f5,1,_stderr);
    fprintf(_stderr,"International Components for Unicode %s\n%s\n","63.1",
            " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
           );
    return uVar1 >> 0x1f;
  }
  if (options[2].doesOccur != '\0') {
    u_setDataDirectory_63(options[2].value);
  }
  bVar2 = options[5].doesOccur != '\0';
  if (bVar2) {
    cmd_millis();
  }
  bVar3 = options[4].doesOccur != '\0';
  bVar4 = options[3].doesOccur != '\0';
  if (bVar4) {
    cmd_version('\0',(UErrorCode *)errorCode);
  }
  if (options[7].doesOccur == '\0') {
    if (options[6].doesOccur == '\0') {
      if (bVar4 || (bVar3 || bVar2)) {
        return 0;
      }
      cmd_version('\0',(UErrorCode *)errorCode);
      return 0;
    }
  }
  else {
    __s = fopen(options[7].value,"w");
    if (__s == (FILE *)0x0) {
      fprintf(_stderr,"ERR: can\'t write to XML file %s\n",options[7].value);
      return 1;
    }
    fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\" ?>\n",0x28,1,__s);
    udbg_writeIcuInfo((FILE *)__s);
    fclose(__s);
    if (options[6].doesOccur == '\0') {
      return 0;
    }
  }
  cmd_cleanup();
  return 0;
}

Assistant:

extern int
main(int argc, char* argv[]) {
    UErrorCode errorCode = U_ZERO_ERROR;
    UBool didSomething = FALSE;
    
    /* preset then read command line options */
    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);

    /* error handling, printing usage message */
    if(argc<0) {
        fprintf(stderr,
            "error in command line argument \"%s\"\n",
            argv[-argc]);
    }
    if( options[0].doesOccur || options[1].doesOccur) {
      fprintf(stderr, "%s: Output information about the current ICU\n", argv[0]);
      fprintf(stderr, "Options:\n"
              " -h     or  --help                 - Print this help message.\n"
              " -m     or  --millisecond-time     - Print the current UTC time in milliseconds.\n"
              " -d <dir>   or  --icudatadir <dir> - Set the ICU Data Directory\n"
              " -v                                - Print version and configuration information about ICU\n"
#if UCONFIG_ENABLE_PLUGINS
              " -L         or  --list-plugins     - List and diagnose issues with ICU Plugins\n"
#endif
              " -K         or  --cleanup          - Call u_cleanup() before exitting (will attempt to unload plugins)\n"
              "\n"
              "If no arguments are given, the tool will print ICU version and configuration information.\n"
              );
      fprintf(stderr, "International Components for Unicode %s\n%s\n", U_ICU_VERSION, U_COPYRIGHT_STRING );
      return argc<0 ? U_ILLEGAL_ARGUMENT_ERROR : U_ZERO_ERROR;
    }
    
    if(options[2].doesOccur) {
      u_setDataDirectory(options[2].value);
    }

    if(options[5].doesOccur) {
      cmd_millis();
      didSomething=TRUE;
    } 
    if(options[4].doesOccur) {
      cmd_listplugins();
      didSomething = TRUE;
    }

    if(options[3].doesOccur) {
      cmd_version(FALSE, errorCode);
      didSomething = TRUE;
    }

    if(options[7].doesOccur) {  /* 2nd part of version: cleanup */
      FILE *out = fopen(options[7].value, "w");
      if(out==NULL) {
        fprintf(stderr,"ERR: can't write to XML file %s\n", options[7].value);
        return 1;
      }
      /* todo: API for writing DTD? */
      fprintf(out, "<?xml version=\"1.0\" encoding=\"UTF-8\" ?>\n");
      udbg_writeIcuInfo(out);
      fclose(out);
      didSomething = TRUE;
    }

    if(options[6].doesOccur) {  /* 2nd part of version: cleanup */
      cmd_cleanup();
      didSomething = TRUE;
    }

    if(!didSomething) {
      cmd_version(FALSE, errorCode);  /* at least print the version # */
    }

    return U_FAILURE(errorCode);
}